

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O1

RegDemoState * __thiscall
despot::MemoryPool<despot::RegDemoState>::Allocate(MemoryPool<despot::RegDemoState> *this)

{
  pointer ppRVar1;
  RegDemoState *pRVar2;
  
  if ((this->freelist_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->freelist_).
      super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    NewChunk(this);
  }
  ppRVar1 = (this->freelist_).
            super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pRVar2 = ppRVar1[-1];
  (this->freelist_).
  super__Vector_base<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppRVar1 + -1;
  if (pRVar2->field_0x8 != '\x01') {
    pRVar2->field_0x8 = 1;
    this->num_allocated_ = this->num_allocated_ + 1;
    return pRVar2;
  }
  __assert_fail("!obj->IsAllocated()",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/include/despot/util/memorypool.h"
                ,0x34,
                "T *despot::MemoryPool<despot::RegDemoState>::Allocate() [T = despot::RegDemoState]"
               );
}

Assistant:

T* Allocate() {
		if (freelist_.empty())
			NewChunk();
		T* obj = freelist_.back();
		freelist_.pop_back();
		assert(!obj->IsAllocated());
		obj->SetAllocated();
		num_allocated_++;
		return obj;
	}